

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

void __thiscall
AbstractModuleClient::sendPlaybackCommand(AbstractModuleClient *this,string *cmd,uint32_t time)

{
  pointer pcVar1;
  TrodesMsg msg;
  long *local_b0 [2];
  long local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  TrodesMsg local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ss4","");
  pcVar1 = (cmd->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + cmd->_M_string_length);
  TrodesMsg::TrodesMsg<char_const*,std::__cxx11::string,unsigned_int>
            (&local_50,&local_70,"_Acq",&local_90,time);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"cmd","");
  MlmWrap::sendMessage(&this->super_MlmWrap,"Trodes",(char *)local_b0[0],&local_50,"",0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  TrodesMsg::~TrodesMsg(&local_50);
  return;
}

Assistant:

void AbstractModuleClient::sendPlaybackCommand(std::string cmd, uint32_t time) {
    TrodesMsg msg("ss4", acquisition_CMD, cmd, time);
    sendMsgToTrodes(TRODES_CMD, msg); //tell trodes to relay the command
}